

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O2

void __thiscall
Iir::Biquad::setCoefficients
          (Biquad *this,double a0,double a1,double a2,double b0,double b1,double b2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if (NAN(a0)) {
    throw_invalid_argument("a0 is NaN");
  }
  if (NAN(a1)) {
    throw_invalid_argument("a1 is NaN");
  }
  if (NAN(a2)) {
    throw_invalid_argument("a2 is NaN");
  }
  if (NAN(b0)) {
    throw_invalid_argument("b0 is NaN");
  }
  if (NAN(b1)) {
    throw_invalid_argument("b1 is NaN");
  }
  if (NAN(b2)) {
    throw_invalid_argument("b2 is NaN");
  }
  this->m_a0 = a0;
  auVar2._8_8_ = a2;
  auVar2._0_8_ = a1;
  auVar3._8_8_ = a0;
  auVar3._0_8_ = a0;
  auVar3 = divpd(auVar2,auVar3);
  this->m_a1 = (double)auVar3._0_8_;
  this->m_a2 = (double)auVar3._8_8_;
  this->m_b0 = b0 / a0;
  auVar4._8_8_ = b2;
  auVar4._0_8_ = b1;
  auVar1._8_8_ = a0;
  auVar1._0_8_ = a0;
  auVar3 = divpd(auVar4,auVar1);
  this->m_b1 = (double)auVar3._0_8_;
  this->m_b2 = (double)auVar3._8_8_;
  return;
}

Assistant:

void Biquad::setCoefficients (double a0, double a1, double a2,
					  double b0, double b1, double b2)
	{
		if (Iir::is_nan (a0)) throw_invalid_argument("a0 is NaN");
		if (Iir::is_nan (a1)) throw_invalid_argument("a1 is NaN");
		if (Iir::is_nan (a2)) throw_invalid_argument("a2 is NaN");
		if (Iir::is_nan (b0)) throw_invalid_argument("b0 is NaN");
		if (Iir::is_nan (b1)) throw_invalid_argument("b1 is NaN");
		if (Iir::is_nan (b2)) throw_invalid_argument("b2 is NaN");

		m_a0 = a0;
		m_a1 = a1/a0;
		m_a2 = a2/a0;
		m_b0 = b0/a0;
		m_b1 = b1/a0;
		m_b2 = b2/a0;
	}